

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r)

{
  int iVar1;
  array_container_t *sc;
  array_container_t *paVar2;
  roaring_array_t *ra;
  long lVar3;
  uint8_t new_type;
  uint8_t local_29;
  
  if (0 < (r->high_low_container).size) {
    lVar3 = 0;
    do {
      local_29 = (r->high_low_container).typecodes[lVar3];
      sc = (array_container_t *)(r->high_low_container).containers[lVar3];
      if (local_29 == '\x04') {
        sc = (array_container_t *)shared_container_extract_copy((shared_container_t *)sc,&local_29);
      }
      if (local_29 == '\x03') {
        paVar2 = (array_container_t *)
                 convert_run_to_efficient_container_and_free((run_container_t *)sc,&local_29);
      }
      else {
        paVar2 = sc;
        if (local_29 != '\x02') {
          iVar1 = bitset_container_compute_cardinality((bitset_container_t *)sc);
          sc->cardinality = iVar1;
          if (iVar1 < 0x1001) {
            paVar2 = array_container_from_bitset((bitset_container_t *)sc);
            bitset_container_free((bitset_container_t *)sc);
            local_29 = '\x02';
          }
        }
      }
      (r->high_low_container).containers[lVar3] = paVar2;
      (r->high_low_container).typecodes[lVar3] = local_29;
      lVar3 = lVar3 + 1;
    } while (lVar3 < (r->high_low_container).size);
  }
  return;
}

Assistant:

void roaring_bitmap_repair_after_lazy(roaring_bitmap_t *r) {
    roaring_array_t *ra = &r->high_low_container;

    for (int i = 0; i < ra->size; ++i) {
        const uint8_t old_type = ra->typecodes[i];
        container_t *old_c = ra->containers[i];
        uint8_t new_type = old_type;
        container_t *new_c = container_repair_after_lazy(old_c, &new_type);
        ra->containers[i] = new_c;
        ra->typecodes[i] = new_type;
    }
}